

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendMemAdvise
          (ze_command_list_handle_t hCommandList,ze_device_handle_t hDevice,void *ptr,size_t size,
          ze_memory_advice_t advice)

{
  ze_pfnCommandListAppendMemAdvise_t pfnAppendMemAdvise;
  ze_result_t result;
  ze_memory_advice_t advice_local;
  size_t size_local;
  void *ptr_local;
  ze_device_handle_t hDevice_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendMemAdvise._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c3d0 != (code *)0x0) {
    pfnAppendMemAdvise._0_4_ = (*DAT_0011c3d0)(hCommandList,hDevice,ptr,size,advice);
  }
  return (ze_result_t)pfnAppendMemAdvise;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemAdvise(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        ze_device_handle_t hDevice,                     ///< [in] device associated with the memory advice
        const void* ptr,                                ///< [in] Pointer to the start of the memory range
        size_t size,                                    ///< [in] Size in bytes of the memory range
        ze_memory_advice_t advice                       ///< [in] Memory advice for the memory range
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMemAdvise = context.zeDdiTable.CommandList.pfnAppendMemAdvise;
        if( nullptr != pfnAppendMemAdvise )
        {
            result = pfnAppendMemAdvise( hCommandList, hDevice, ptr, size, advice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }